

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O1

void __thiscall
despot::SimpleRockSampleParticleUpperBound::SimpleRockSampleParticleUpperBound
          (SimpleRockSampleParticleUpperBound *this,DSPOMDP *model)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  double *pdVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  iterator iVar3;
  pointer pvVar4;
  long lVar5;
  double dVar6;
  double local_38;
  double local_30;
  
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  *(undefined ***)this = &PTR__SimpleRockSampleParticleUpperBound_0010ac60;
  this_00 = &this->upper_bounds_;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_00,3);
  pvVar2 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = _ParticleBelief * 10.0;
  iVar3._M_current =
       (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar3._M_current ==
      (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(pvVar2,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_38;
    (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  pvVar2 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = _ParticleBelief * _ParticleBelief * 10.0 + 10.0;
  iVar3._M_current =
       (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar3._M_current ==
      (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(pvVar2,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_38;
    (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  pvVar4 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = 10.0;
  iVar3._M_current =
       *(pointer *)
        ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar4 + 1,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = 10.0;
    *(double **)
     ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data + 8) = iVar3._M_current + 1;
  }
  pvVar4 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_30 = _ParticleBelief;
  dVar6 = pow(_ParticleBelief,3.0);
  local_38 = local_30 * 10.0 + dVar6 * 10.0;
  iVar3._M_current =
       *(pointer *)
        ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar4 + 1,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_38;
    *(double **)
     ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data + 8) = iVar3._M_current + 1;
  }
  pvVar4 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = *(long *)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  pdVar1 = (double *)(lVar5 + 8);
  if (*pdVar1 <= 10.0 && *pdVar1 != 10.0) {
    *(undefined8 *)(lVar5 + 8) = 0x4024000000000000;
  }
  local_38 = 0.0;
  iVar3._M_current =
       *(pointer *)
        ((long)&pvVar4[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&pvVar4[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar4 + 2,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = 0.0;
    *(double **)
     ((long)&pvVar4[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data + 8) = iVar3._M_current + 1;
  }
  pvVar4 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = 0.0;
  iVar3._M_current =
       *(pointer *)
        ((long)&pvVar4[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&pvVar4[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar4 + 2,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = 0.0;
    *(double **)
     ((long)&pvVar4[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data + 8) = iVar3._M_current + 1;
  }
  return;
}

Assistant:

SimpleRockSampleParticleUpperBound(const DSPOMDP* model) {
		upper_bounds_.resize(3);
		upper_bounds_[0].push_back(Globals::Discount(1) * 10);
		upper_bounds_[0].push_back(10 + Globals::Discount(2) * 10);
		upper_bounds_[1].push_back(10);
		upper_bounds_[1].push_back(Globals::Discount(1) * 10 + Globals::Discount(3) * 10);
		if (upper_bounds_[1][1] < 10)
			upper_bounds_[1][1] = 10;
		upper_bounds_[2].push_back(0);
		upper_bounds_[2].push_back(0);
	}